

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

Result<wallet::SelectionResult> * wallet::ErrorMaxWeightExceeded(void)

{
  Result<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  bilingual_str bStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _(&bStack_58,(ConstevalStringLiteral)0x700260);
  std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
  _Variant_storage<0ul,bilingual_str>();
  bilingual_str::~bilingual_str(&bStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> ErrorMaxWeightExceeded()
{
    return util::Error{_("The inputs size exceeds the maximum weight. "
                         "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
}